

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt.c
# Opt level: O0

_Bool COSE_Enveloped_Free(HCOSE_ENVELOPED h)

{
  _Bool _Var1;
  COSE_Enveloped *p;
  HCOSE_ENVELOPED h_local;
  
  _Var1 = IsValidEnvelopedHandle(h);
  if (_Var1) {
    if (*(int *)(h + 0x10) < 2) {
      _COSE_RemoveFromList(&EnvelopedRoot,(COSE *)h);
      _COSE_Enveloped_Release((COSE_Enveloped *)h);
      free(h);
      h_local._7_1_ = true;
    }
    else {
      *(int *)(h + 0x10) = *(int *)(h + 0x10) + -1;
      h_local._7_1_ = true;
    }
  }
  else {
    h_local._7_1_ = false;
  }
  return h_local._7_1_;
}

Assistant:

bool COSE_Enveloped_Free(HCOSE_ENVELOPED h)
{
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context *context;
#endif
	COSE_Enveloped * p = (COSE_Enveloped *)h;

	if (!IsValidEnvelopedHandle(h)) return false;

	if (p->m_message.m_refCount > 1) {
		p->m_message.m_refCount--;
		return true;
	}

#ifdef USE_CBOR_CONTEXT
	context = &((COSE_Enveloped *)h)->m_message.m_allocContext;
#endif

	_COSE_RemoveFromList(&EnvelopedRoot, &p->m_message);

	_COSE_Enveloped_Release((COSE_Enveloped *)h);

	COSE_FREE((COSE_Enveloped *)h, context);

	return true;
}